

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall ncnn::NetPrivate::update_input_output_indexes(NetPrivate *this)

{
  value_type_conflict4 *pvVar1;
  reference ppLVar2;
  vector<int,_std::allocator<int>_> *pvVar3;
  reference pvVar4;
  vector<int,_std::allocator<int>_> *in_RDI;
  size_t i_1;
  int blob_index;
  size_t i;
  value_type_conflict4 *in_stack_ffffffffffffffb8;
  vector<int,_std::allocator<int>_> *this_00;
  value_type_conflict4 *__x;
  vector<int,_std::allocator<int>_> *local_20;
  value_type_conflict4 *local_10;
  
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x157d1c);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x157d2a);
  local_10 = (value_type_conflict4 *)0x0;
  while( true ) {
    __x = local_10;
    pvVar1 = (value_type_conflict4 *)
             std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                       ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                        &in_RDI[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish);
    if (pvVar1 <= __x) break;
    ppLVar2 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                        ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                         &in_RDI[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish,(size_type)local_10);
    if ((*ppLVar2)->typeindex == 0x10) {
      ppLVar2 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                           &in_RDI[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish,(size_type)local_10);
      std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar2)->tops,0);
      std::vector<int,_std::allocator<int>_>::push_back(in_RDI,__x);
    }
    local_10 = (value_type_conflict4 *)((long)local_10 + 1);
  }
  local_20 = (vector<int,_std::allocator<int>_> *)0x0;
  while( true ) {
    this_00 = local_20;
    pvVar3 = (vector<int,_std::allocator<int>_> *)
             std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::size
                       ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                        &(in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish);
    if (pvVar3 <= this_00) break;
    pvVar4 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                       ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                        &(in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish,(size_type)local_20);
    if (pvVar4->producer != -1) {
      pvVar4 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                         ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                          &(in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_finish,(size_type)local_20);
      if (pvVar4->consumer == -1) {
        std::vector<int,_std::allocator<int>_>::push_back(this_00,in_stack_ffffffffffffffb8);
      }
    }
    local_20 = (vector<int,_std::allocator<int>_> *)
               ((long)&(local_20->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start + 1);
  }
  return;
}

Assistant:

void NetPrivate::update_input_output_indexes()
{
    input_blob_indexes.clear();
    output_blob_indexes.clear();

    for (size_t i = 0; i < layers.size(); i++)
    {
        if (layers[i]->typeindex == LayerType::Input)
        {
            int blob_index = layers[i]->tops[0];
            input_blob_indexes.push_back(blob_index);
        }
    }

    for (size_t i = 0; i < blobs.size(); i++)
    {
        if (blobs[i].producer != -1 && blobs[i].consumer == -1)
        {
            output_blob_indexes.push_back(i);
        }
    }
}